

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O3

void __thiscall embree::XMLWriter::store_array_elt(XMLWriter *this,Triangle *v)

{
  ostream *poVar1;
  
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&this->field_0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void XMLWriter::store_array_elt(const SceneGraph::TriangleMeshNode::Triangle& v) {
    xml << v.v0 << " " << v.v1 << " " << v.v2 << std::endl;
  }